

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxflow.c
# Opt level: O0

void max_flow_destroy(MaxFlow *mf)

{
  MaxFlow *mf_local;
  
  if (mf->kind == MAXFLOW_ALGO_PUSH_RELABEL) {
    max_flow_destroy_push_relabel(mf);
  }
  else {
    if (mf->kind != MAXFLOW_ALGO_BRUTEFORCE) {
      __assert_fail("!\"Invalid code path\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/maxflow.c"
                    ,0x4d,"void max_flow_destroy(MaxFlow *)");
    }
    max_flow_result_destroy(&(mf->payload).field_0.temp_mf);
  }
  memset(mf,0,0x40);
  return;
}

Assistant:

void max_flow_destroy(MaxFlow *mf) {

    switch (mf->kind) {
    case MAXFLOW_ALGO_BRUTEFORCE:
        max_flow_result_destroy(&mf->payload.temp_mf);
        break;
    case MAXFLOW_ALGO_PUSH_RELABEL:
        max_flow_destroy_push_relabel(mf);
        break;
    default:
        assert(!"Invalid code path");
        break;
    }

    memset(mf, 0, sizeof(*mf));
}